

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O0

void ncnn::draw_rectangle_c2
               (uchar *pixels,int w,int h,int stride,int rx,int ry,int rw,int rh,uint color,
               int thickness)

{
  int iVar1;
  int iVar2;
  uchar *p_4;
  int y_4;
  int x_4;
  uchar *p_3;
  int local_68;
  int y_3;
  int x_3;
  int x_2;
  uchar *p_2;
  int y_2;
  int x_1;
  uchar *p_1;
  int y_1;
  int t1;
  int t0;
  int x;
  uchar *p;
  int y;
  uchar *pen_color;
  int ry_local;
  int rx_local;
  int stride_local;
  int h_local;
  int w_local;
  
  p._4_4_ = ry;
  if (thickness == -1) {
    for (; p._4_4_ < ry + rh; p._4_4_ = p._4_4_ + 1) {
      if (-1 < p._4_4_) {
        if (h <= p._4_4_) {
          return;
        }
        for (t1 = rx; t1 < rx + rw; t1 = t1 + 1) {
          if (-1 < t1) {
            if (w <= t1) break;
            pixels[(long)(t1 << 1) + (long)(stride * p._4_4_)] = (uchar)color;
            pixels[(long)(t1 * 2 + 1) + (long)(stride * p._4_4_)] = color._1_1_;
          }
        }
      }
    }
  }
  else {
    iVar1 = thickness / 2;
    iVar2 = thickness - iVar1;
    for (p_1._0_4_ = ry - iVar1; (int)p_1 < ry + iVar2; p_1._0_4_ = (int)p_1 + 1) {
      if (-1 < (int)p_1) {
        if (h <= (int)p_1) break;
        for (p_2._4_4_ = rx - iVar1; p_2._4_4_ < rx + rw + iVar2; p_2._4_4_ = p_2._4_4_ + 1) {
          if (-1 < p_2._4_4_) {
            if (w <= p_2._4_4_) break;
            pixels[(long)(p_2._4_4_ << 1) + (long)(stride * (int)p_1)] = (uchar)color;
            pixels[(long)(p_2._4_4_ * 2 + 1) + (long)(stride * (int)p_1)] = color._1_1_;
          }
        }
      }
    }
    for (p_2._0_4_ = (ry + rh) - iVar1; (int)p_2 < ry + rh + iVar2; p_2._0_4_ = (int)p_2 + 1) {
      if (-1 < (int)p_2) {
        if (h <= (int)p_2) break;
        for (y_3 = rx - iVar1; y_3 < rx + rw + iVar2; y_3 = y_3 + 1) {
          if (-1 < y_3) {
            if (w <= y_3) break;
            pixels[(long)(y_3 << 1) + (long)(stride * (int)p_2)] = (uchar)color;
            pixels[(long)(y_3 * 2 + 1) + (long)(stride * (int)p_2)] = color._1_1_;
          }
        }
      }
    }
    for (local_68 = rx - iVar1; local_68 < rx + iVar2; local_68 = local_68 + 1) {
      if (-1 < local_68) {
        if (w <= local_68) break;
        for (p_3._4_4_ = ry + iVar2; p_3._4_4_ < (ry + rh) - iVar1; p_3._4_4_ = p_3._4_4_ + 1) {
          if (-1 < p_3._4_4_) {
            if (h <= p_3._4_4_) break;
            pixels[(long)(local_68 << 1) + (long)(stride * p_3._4_4_)] = (uchar)color;
            pixels[(long)(local_68 * 2 + 1) + (long)(stride * p_3._4_4_)] = color._1_1_;
          }
        }
      }
    }
    for (p_4._4_4_ = (rx + rw) - iVar1; p_4._4_4_ < rx + rw + iVar2; p_4._4_4_ = p_4._4_4_ + 1) {
      if (-1 < p_4._4_4_) {
        if (w <= p_4._4_4_) {
          return;
        }
        for (p_4._0_4_ = ry + iVar2; (int)p_4 < (ry + rh) - iVar1; p_4._0_4_ = (int)p_4 + 1) {
          if (-1 < (int)p_4) {
            if (h <= (int)p_4) break;
            pixels[(long)(p_4._4_4_ << 1) + (long)(stride * (int)p_4)] = (uchar)color;
            pixels[(long)(p_4._4_4_ * 2 + 1) + (long)(stride * (int)p_4)] = color._1_1_;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void draw_rectangle_c2(unsigned char* pixels, int w, int h, int stride, int rx, int ry, int rw, int rh, unsigned int color, int thickness)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    if (thickness == -1)
    {
        // filled
        for (int y = ry; y < ry + rh; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx; x < rx + rw; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }

        return;
    }

    const int t0 = thickness / 2;
    const int t1 = thickness - t0;

    // draw top
    {
        for (int y = ry - t0; y < ry + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw bottom
    {
        for (int y = ry + rh - t0; y < ry + rh + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw left
    for (int x = rx - t0; x < rx + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }

    // draw right
    for (int x = rx + rw - t0; x < rx + rw + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }
}